

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::emitSphere(SemanticParser *this,SP *shape)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  float fVar14;
  SP SVar15;
  undefined1 local_89;
  element_type *local_88;
  _Base_ptr p_Stack_80;
  undefined1 local_78 [32];
  SP local_58;
  SP local_48;
  _Base_ptr local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_38 = *(_Base_ptr *)(*in_RDX + 0x58);
  local_30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x60);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_78,(SP *)shape);
  std::__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::Sphere>,std::shared_ptr<pbrt::Material>>
            ((__shared_ptr<pbrt::Sphere,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (allocator<pbrt::Sphere> *)&local_89,(shared_ptr<pbrt::Material> *)local_78);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  lVar1 = *in_RDX;
  uVar2 = *(undefined4 *)(lVar1 + 0x78);
  uVar3 = *(undefined4 *)(lVar1 + 0x7c);
  uVar4 = *(undefined4 *)(lVar1 + 0x80);
  uVar5 = *(undefined4 *)(lVar1 + 0x84);
  uVar6 = *(undefined4 *)(lVar1 + 0x88);
  uVar7 = *(undefined4 *)(lVar1 + 0x8c);
  uVar8 = *(undefined4 *)(lVar1 + 0x90);
  uVar9 = *(undefined4 *)(lVar1 + 0x94);
  uVar10 = *(undefined4 *)(lVar1 + 0x9c);
  uVar11 = *(undefined4 *)(lVar1 + 0xa0);
  uVar12 = *(undefined4 *)(lVar1 + 0xa4);
  *(undefined4 *)
   &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&local_88[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
            super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       *(undefined4 *)(lVar1 + 0x98);
  *(undefined4 *)
   ((long)&local_88[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 0xc) = uVar10;
  *(undefined4 *)
   &local_88[1].cameras.
    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
    ._M_impl.super__Vector_impl_data = uVar11;
  *(undefined4 *)
   ((long)&local_88[1].cameras.
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 4) = uVar12;
  *(undefined4 *)&local_88[1].super_Entity._vptr_Entity = uVar6;
  *(undefined4 *)((long)&local_88[1].super_Entity._vptr_Entity + 4) = uVar7;
  *(undefined4 *)
   &local_88[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar8;
  *(undefined4 *)
   ((long)&local_88[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4) = uVar9;
  *(undefined4 *)
   &(local_88->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar2;
  *(undefined4 *)
   ((long)&(local_88->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
   ) = uVar3;
  *(undefined4 *)
   &(local_88->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = uVar4;
  *(undefined4 *)
   ((long)&(local_88->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar5;
  lVar1 = *in_RDX;
  local_78._0_8_ = (element_type *)(local_78 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"radius","");
  fVar14 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),(string *)local_78,0.0);
  *(float *)((long)&local_88[1].cameras.
                    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                    ._M_impl.super__Vector_impl_data + 8) = fVar14;
  if ((element_type *)local_78._0_8_ != (element_type *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
  }
  local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88;
  local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_80;
  if (p_Stack_80 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&p_Stack_80->_M_parent = *(int *)&p_Stack_80->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&p_Stack_80->_M_parent = *(int *)&p_Stack_80->_M_parent + 1;
    }
  }
  local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  extractTextures((SemanticParser *)shape,&local_48,&local_58);
  _Var13._M_pi = extraout_RDX;
  if (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var13._M_pi = extraout_RDX_00;
  }
  if ((_Base_ptr)
      local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var13._M_pi = extraout_RDX_01;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_80;
  SVar15.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  SVar15.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar15.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitSphere(pbrt::syntactic::Shape::SP shape)
  {
    Sphere::SP ours = std::make_shared<Sphere>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
    extractTextures(ours,shape);
      
    return ours;
  }